

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O2

char * tok_casefold_defsym(tokcxdef *ctx,char *outbuf,char *src,int len)

{
  ushort **ppuVar1;
  __int32_t **pp_Var2;
  char *pcVar3;
  int iVar4;
  byte bVar5;
  long lVar6;
  
  pcVar3 = src;
  if ((ctx->tokcxflg & 2) != 0) {
    iVar4 = 0x27;
    if (len < 0x27) {
      iVar4 = len;
    }
    lVar6 = 0;
    for (; pcVar3 = outbuf, 0 < iVar4; iVar4 = iVar4 + -1) {
      ppuVar1 = __ctype_b_loc();
      bVar5 = src[lVar6];
      if ((*(byte *)((long)*ppuVar1 + (ulong)bVar5 * 2 + 1) & 1) != 0) {
        pp_Var2 = __ctype_tolower_loc();
        bVar5 = *(byte *)(*pp_Var2 + bVar5);
      }
      outbuf[lVar6] = bVar5;
      lVar6 = lVar6 + 1;
    }
  }
  return pcVar3;
}

Assistant:

static char *tok_casefold_defsym(tokcxdef *ctx, char *outbuf,
                                 char *src, int len)
{
    if (ctx->tokcxflg & TOKCXCASEFOLD)
    {
        char *dst;
        int   rem;

        /* make a lower-case copy of the symbol */
        rem = (len > TOKNAMMAX ? TOKNAMMAX : len);
        for (dst = outbuf ; rem > 0 ; ++dst, ++src, --rem)
            *dst = (isupper((uchar)*src) ? tolower((uchar)*src) : *src);

        /* use the lower-case copy instead of the original */
        return outbuf;
    }
    else
    {
        /* return the original unchanged */
        return src;
    }
}